

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O2

bool __thiscall
cmListCommand::HandleSublistCommand
          (cmListCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  pointer pbVar2;
  cmMakefile *this_00;
  pointer pbVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  ostream *poVar7;
  ulong uVar8;
  string *name;
  ulong uVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sublist;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  varArgsExpanded;
  ostringstream error;
  string sStack_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  ostream local_1a8;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((long)pbVar2 - (long)pbVar1 != 0xa0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    poVar7 = std::operator<<(&local_1a8,"sub-command SUBLIST requires four arguments (");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::operator<<(poVar7," found).");
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&sStack_1e8);
    std::__cxx11::string::~string((string *)&sStack_1e8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    return false;
  }
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar4 = GetList(this,&local_1c8,pbVar1 + 1);
  pbVar3 = local_1c8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar1 = local_1c8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  name = pbVar2 + -1;
  if ((!bVar4) ||
     (local_1c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_1c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    bVar4 = true;
    cmMakefile::AddDefinition((this->super_cmCommand).Makefile,name,"");
    goto LAB_0021cd66;
  }
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar5 = atoi(pbVar2[2]._M_dataplus._M_p);
  iVar6 = atoi(pbVar2[3]._M_dataplus._M_p);
  if ((int)uVar5 < 0) {
LAB_0021ccec:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    poVar7 = std::operator<<(&local_1a8,"begin index: ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar5);
    poVar7 = std::operator<<(poVar7," is out of range 0 - ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&sStack_1e8);
  }
  else {
    uVar8 = (long)pbVar3 - (long)pbVar1 >> 5;
    if (uVar8 <= uVar5) goto LAB_0021ccec;
    if (-2 < iVar6) {
      uVar9 = (ulong)(uVar5 + iVar6);
      if (uVar8 < uVar5 + iVar6) {
        uVar9 = uVar8;
      }
      if (iVar6 == -1) {
        uVar9 = uVar8;
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      vector<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&sStack_1e8,
                 pbVar1 + uVar5,pbVar1 + uVar9,(allocator_type *)&local_1a8);
      this_00 = (this->super_cmCommand).Makefile;
      cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((string *)&local_1a8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&sStack_1e8,";");
      cmMakefile::AddDefinition(this_00,name,(char *)local_1a8._vptr_basic_ostream);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&sStack_1e8);
      bVar4 = true;
      goto LAB_0021cd66;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    poVar7 = std::operator<<(&local_1a8,"length: ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar6);
    std::operator<<(poVar7," should be -1 or greater");
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&sStack_1e8);
  }
  std::__cxx11::string::~string((string *)&sStack_1e8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  bVar4 = false;
LAB_0021cd66:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c8);
  return bVar4;
}

Assistant:

bool cmListCommand::HandleSublistCommand(std::vector<std::string> const& args)
{
  if (args.size() != 5) {
    std::ostringstream error;
    error << "sub-command SUBLIST requires four arguments (" << args.size() - 1
          << " found).";
    this->SetError(error.str());
    return false;
  }

  const std::string& listName = args[1];
  const std::string& variableName = args.back();

  // expand the variable
  std::vector<std::string> varArgsExpanded;
  if (!this->GetList(varArgsExpanded, listName) || varArgsExpanded.empty()) {
    this->Makefile->AddDefinition(variableName, "");
    return true;
  }

  const int start = atoi(args[2].c_str());
  const int length = atoi(args[3].c_str());

  using size_type = decltype(varArgsExpanded)::size_type;

  if (start < 0 || size_type(start) >= varArgsExpanded.size()) {
    std::ostringstream error;
    error << "begin index: " << start << " is out of range 0 - "
          << varArgsExpanded.size() - 1;
    this->SetError(error.str());
    return false;
  }
  if (length < -1) {
    std::ostringstream error;
    error << "length: " << length << " should be -1 or greater";
    this->SetError(error.str());
    return false;
  }

  const size_type end =
    (length == -1 || size_type(start + length) > varArgsExpanded.size())
    ? varArgsExpanded.size()
    : size_type(start + length);
  std::vector<std::string> sublist(varArgsExpanded.begin() + start,
                                   varArgsExpanded.begin() + end);
  this->Makefile->AddDefinition(variableName, cmJoin(sublist, ";").c_str());
  return true;
}